

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl_engine.cpp
# Opt level: O1

void __thiscall
polyscope::render::backend_openGL3_glfw::GLShaderProgram::setUniform
          (GLShaderProgram *this,string *name,uint val)

{
  pointer pGVar1;
  size_t __n;
  int iVar2;
  invalid_argument *piVar3;
  pointer pGVar4;
  bool bVar5;
  bool bVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  (*glad_glUseProgram)
            (((this->compiledProgram).
              super___shared_ptr<polyscope::render::backend_openGL3_glfw::GLCompiledProgram,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr)->programHandle);
  pGVar4 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pGVar1 = (this->uniforms).
           super__Vector_base<polyscope::render::backend_openGL3_glfw::GLShaderUniform,_std::allocator<polyscope::render::backend_openGL3_glfw::GLShaderUniform>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  do {
    bVar5 = pGVar4 == pGVar1;
    if (bVar5) {
LAB_00284f81:
      piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
      std::operator+(&local_50,"Tried to set nonexistent uniform with name ",name);
      std::invalid_argument::invalid_argument(piVar3,(string *)&local_50);
      __cxa_throw(piVar3,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
    }
    __n = (pGVar4->name)._M_string_length;
    if (__n == name->_M_string_length) {
      if (__n == 0) {
        bVar6 = true;
      }
      else {
        iVar2 = bcmp((pGVar4->name)._M_dataplus._M_p,(name->_M_dataplus)._M_p,__n);
        bVar6 = iVar2 == 0;
      }
    }
    else {
      bVar6 = false;
    }
    if (bVar6) {
      if (pGVar4->location != -1) {
        if (pGVar4->type != UInt) {
          piVar3 = (invalid_argument *)__cxa_allocate_exception(0x10);
          std::invalid_argument::invalid_argument
                    (piVar3,"Tried to set GLShaderUniform with wrong type");
          __cxa_throw(piVar3,&std::invalid_argument::typeinfo,
                      std::invalid_argument::~invalid_argument);
        }
        (*glad_glUniform1ui)(pGVar4->location,val);
        pGVar4->isSet = true;
      }
      if (bVar6) {
        if (!bVar5) {
          return;
        }
        goto LAB_00284f81;
      }
    }
    pGVar4 = pGVar4 + 1;
  } while( true );
}

Assistant:

void GLShaderProgram::setUniform(std::string name, unsigned int val) {
  glUseProgram(compiledProgram->getHandle());

  for (GLShaderUniform& u : uniforms) {
    if (u.name == name) {
      if (u.location == -1) return;
      if (u.type == RenderDataType::UInt) {
        glUniform1ui(u.location, val);
        u.isSet = true;
      } else {
        throw std::invalid_argument("Tried to set GLShaderUniform with wrong type");
      }
      return;
    }
  }
  throw std::invalid_argument("Tried to set nonexistent uniform with name " + name);
}